

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PortConcatenationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PortConcatenationSyntax,slang::syntax::PortConcatenationSyntax_const&>
          (BumpAllocator *this,PortConcatenationSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  PortConcatenationSyntax *pPVar8;
  
  pPVar8 = (PortConcatenationSyntax *)allocate(this,0x70,8);
  (pPVar8->super_PortExpressionSyntax).super_SyntaxNode.previewNode =
       (args->super_PortExpressionSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_PortExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PortExpressionSyntax).super_SyntaxNode.parent;
  (pPVar8->super_PortExpressionSyntax).super_SyntaxNode.kind =
       (args->super_PortExpressionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar8->super_PortExpressionSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pPVar8->super_PortExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = (args->openBrace).field_0x2;
  NVar6.raw = (args->openBrace).numFlags.raw;
  uVar7 = (args->openBrace).rawLen;
  pIVar2 = (args->openBrace).info;
  (pPVar8->openBrace).kind = (args->openBrace).kind;
  (pPVar8->openBrace).field_0x2 = uVar5;
  (pPVar8->openBrace).numFlags = (NumericTokenFlags)NVar6.raw;
  (pPVar8->openBrace).rawLen = uVar7;
  (pPVar8->openBrace).info = pIVar2;
  (pPVar8->references).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->references).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->references).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->references).super_SyntaxListBase.super_SyntaxNode.parent;
  (pPVar8->references).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->references).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar8->references).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pPVar8->references).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pPVar8->references).super_SyntaxListBase.childCount =
       (args->references).super_SyntaxListBase.childCount;
  (pPVar8->references).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002db858;
  sVar3 = (args->references).elements._M_extent._M_extent_value;
  (pPVar8->references).elements._M_ptr = (args->references).elements._M_ptr;
  (pPVar8->references).elements._M_extent._M_extent_value = sVar3;
  uVar5 = (args->closeBrace).field_0x2;
  NVar6.raw = (args->closeBrace).numFlags.raw;
  uVar7 = (args->closeBrace).rawLen;
  pIVar2 = (args->closeBrace).info;
  (pPVar8->closeBrace).kind = (args->closeBrace).kind;
  (pPVar8->closeBrace).field_0x2 = uVar5;
  (pPVar8->closeBrace).numFlags = (NumericTokenFlags)NVar6.raw;
  (pPVar8->closeBrace).rawLen = uVar7;
  (pPVar8->closeBrace).info = pIVar2;
  return pPVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }